

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O0

void __thiscall
HighsPrimalHeuristics::RINS
          (HighsPrimalHeuristics *this,vector<double,_std::allocator<double>_> *relaxationsol)

{
  double dVar1;
  undefined1 auVar2 [16];
  anon_class_8_1_8991fb9c_for__M_pred __pred;
  anon_class_16_2_405d1b53 comp;
  anon_class_16_2_56b3b2aa __pred_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  const_iterator __first_00;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  end;
  bool bVar3;
  HighsInt HVar4;
  pointer pHVar5;
  size_type sVar6;
  HighsSearch *this_00;
  int64_t iVar7;
  double *pdVar8;
  HighsSolution *pHVar9;
  reference piVar10;
  const_reference pvVar11;
  pointer ppVar12;
  reference pvVar13;
  HighsMipSolverData *this_01;
  HighsBasis *nodeOffset;
  HighsLpRelaxation *pHVar14;
  _Base_ptr in_RSI;
  long *in_RDI;
  vector<double,_std::allocator<double>_> *this_02;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  *p_Var15;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int64_t new_lp_iterations;
  bool solve_sub_mip_return;
  double fixval_1;
  iterator fracint;
  double change;
  double fixval;
  HighsInt i;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<double,_std::allocator<double>_> *currlpsol;
  double stopFixingRate;
  HighsInt numBranched;
  anon_class_32_4_ffb23deb getFixVal;
  bool fixtolpsol;
  iterator fixcandend;
  HeuristicNeighbourhood neighbourhood;
  HighsInt targetdepth;
  HighsInt nbacktracks;
  bool stop;
  double fixingrate;
  double minfixingrate;
  double maxfixingrate;
  HighsLpRelaxation heurlp;
  HighsDomain *localdom;
  HighsSearch heur;
  HighsPseudocost pscost;
  int in_stack_ffffffffffffa248;
  HighsInt in_stack_ffffffffffffa24c;
  undefined4 in_stack_ffffffffffffa250;
  undefined4 in_stack_ffffffffffffa254;
  int64_t in_stack_ffffffffffffa258;
  HighsSearch *in_stack_ffffffffffffa260;
  undefined4 in_stack_ffffffffffffa268;
  HighsInt in_stack_ffffffffffffa26c;
  const_iterator in_stack_ffffffffffffa270;
  undefined4 in_stack_ffffffffffffa278;
  HighsInt in_stack_ffffffffffffa27c;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_ffffffffffffa280;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_ffffffffffffa288;
  long in_stack_ffffffffffffa290;
  HighsDomain *in_stack_ffffffffffffa298;
  undefined7 in_stack_ffffffffffffa2a0;
  byte in_stack_ffffffffffffa2a7;
  HighsMipSolver *in_stack_ffffffffffffa2a8;
  HighsLpRelaxation *in_stack_ffffffffffffa2b0;
  HighsPseudocost *in_stack_ffffffffffffa2b8;
  HighsPseudocost *in_stack_ffffffffffffa2c0;
  double in_stack_ffffffffffffa2c8;
  HighsPseudocost *in_stack_ffffffffffffa2d0;
  HighsMipSolver *in_stack_ffffffffffffa2d8;
  HighsSearch *in_stack_ffffffffffffa2e0;
  HighsMipSolver *in_stack_ffffffffffffa300;
  HighsSearch *in_stack_ffffffffffffa308;
  HighsConflictPool *in_stack_ffffffffffffa318;
  undefined4 in_stack_ffffffffffffa320;
  int in_stack_ffffffffffffa324;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  *in_stack_ffffffffffffa350;
  undefined4 in_stack_ffffffffffffa358;
  int in_stack_ffffffffffffa35c;
  double *in_stack_ffffffffffffa370;
  undefined4 in_stack_ffffffffffffa378;
  int in_stack_ffffffffffffa37c;
  undefined8 in_stack_ffffffffffffa380;
  Highs *in_stack_ffffffffffffa388;
  HighsDomain *in_stack_ffffffffffffa4e8;
  undefined1 local_5b10 [144];
  _Base_ptr local_5a80;
  HighsSearch *local_5a70;
  undefined1 local_5a61;
  _Base_ptr local_5a60;
  pair<int,_double> *local_5a50;
  pair<int,_double> *local_5a48;
  pair<int,_double> *local_5a40;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_5a38;
  undefined4 local_5a2c;
  int local_59d4;
  int local_59d0;
  byte local_59c9;
  HighsMipSolver *local_59c8;
  double local_59c0;
  double local_59b8;
  int local_59b0 [46];
  HighsLpRelaxation *in_stack_ffffffffffffa708;
  HighsLpRelaxation *in_stack_ffffffffffffa710;
  HighsInt in_stack_ffffffffffffae5c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffae60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffae68;
  pointer in_stack_ffffffffffffae70;
  HighsBasis *in_stack_ffffffffffffae78;
  HighsLp *in_stack_ffffffffffffae80;
  HighsPrimalHeuristics *in_stack_ffffffffffffae88;
  HighsInt in_stack_ffffffffffffaea0;
  HighsInt in_stack_ffffffffffffaea8;
  HighsSearch local_5e0;
  int *local_50;
  int *local_48;
  int *local_30;
  int *local_28;
  int *local_20;
  _Base_ptr local_10;
  
  local_10 = in_RSI;
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x671476);
  bVar3 = HighsDomain::infeasible(&pHVar5->domain);
  if (!bVar3) {
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_10);
    HVar4 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
    if (sVar6 == (long)HVar4) {
      local_28 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
      local_30 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
      __first._M_current._4_4_ = in_stack_ffffffffffffa27c;
      __first._M_current._0_4_ = in_stack_ffffffffffffa278;
      __pred.this._4_4_ = in_stack_ffffffffffffa26c;
      __pred.this._0_4_ = in_stack_ffffffffffffa268;
      local_20 = (int *)std::
                        remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__0>
                                  (__first,in_stack_ffffffffffffa270._M_current,__pred);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
      local_48 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
      __first_00._M_current._4_4_ = in_stack_ffffffffffffa27c;
      __first_00._M_current._0_4_ = in_stack_ffffffffffffa278;
      local_50 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_ffffffffffffa26c,in_stack_ffffffffffffa268),
                                   __first_00,in_stack_ffffffffffffa270);
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x6715bb);
      HighsPseudocost::HighsPseudocost(in_stack_ffffffffffffa2c0,in_stack_ffffffffffffa2b8);
      HighsSearch::HighsSearch
                (in_stack_ffffffffffffa2e0,in_stack_ffffffffffffa2d8,in_stack_ffffffffffffa2d0);
      this_00 = (HighsSearch *)HighsSearch::getLocalDomain(&local_5e0);
      HighsSearch::setHeuristic(&local_5e0,true);
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x67164e);
      HighsLpRelaxation::HighsLpRelaxation(in_stack_ffffffffffffa710,in_stack_ffffffffffffa708);
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x67167e);
      HighsLpRelaxation::setObjectiveLimit
                (in_stack_ffffffffffffa2b0,(double)in_stack_ffffffffffffa2a8);
      HighsLpRelaxation::setAdjustSymmetricBranchingCol((HighsLpRelaxation *)local_59b0,false);
      HighsSearch::setLpRelaxation(&local_5e0,(HighsLpRelaxation *)local_59b0);
      HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)local_59b0);
      HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x671711);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x67172d);
      Highs::changeColsBounds
                (in_stack_ffffffffffffa388,(HighsInt)((ulong)in_stack_ffffffffffffa380 >> 0x20),
                 (HighsInt)in_stack_ffffffffffffa380,
                 (double *)CONCAT44(in_stack_ffffffffffffa37c,in_stack_ffffffffffffa378),
                 in_stack_ffffffffffffa370);
      HighsDomain::clearChangedCols((HighsDomain *)in_stack_ffffffffffffa270._M_current);
      HighsSearch::createNewNode
                ((HighsSearch *)CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250));
      local_59b8 = determineTargetFixingRate
                             ((HighsPrimalHeuristics *)in_stack_ffffffffffffa280._M_current);
      local_59c0 = 0.25;
      local_59c8 = (HighsMipSolver *)0x0;
      local_59c9 = 0;
      local_59d0 = -1;
      local_59d4 = 1;
      HeuristicNeighbourhood::HeuristicNeighbourhood
                ((HeuristicNeighbourhood *)in_stack_ffffffffffffa2b0,in_stack_ffffffffffffa2a8,
                 (HighsDomain *)CONCAT17(in_stack_ffffffffffffa2a7,in_stack_ffffffffffffa2a0));
LAB_006717f8:
      local_59d0 = local_59d0 + 1;
      HeuristicNeighbourhood::backtracked
                ((HeuristicNeighbourhood *)
                 CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250));
      HVar4 = HighsSearch::getCurrentDepth
                        ((HighsSearch *)
                         CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250));
      if ((HVar4 <= local_59d4) ||
         (bVar3 = HighsSearch::backtrackUntilDepth
                            (in_stack_ffffffffffffa308,
                             (HighsInt)((ulong)in_stack_ffffffffffffa300 >> 0x20)), bVar3)) {
        do {
          while( true ) {
            while( true ) {
              HighsSearch::evaluateNode
                        ((HighsSearch *)
                         CONCAT44(in_stack_ffffffffffffa37c,in_stack_ffffffffffffa378));
              bVar3 = HighsSearch::currentNodePruned((HighsSearch *)0x671934);
              if (!bVar3) break;
              local_59d0 = local_59d0 + 1;
              pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x671974);
              bVar3 = HighsDomain::infeasible(&pHVar5->domain);
              if (bVar3) {
                iVar7 = HighsSearch::getLocalLpIterations(&local_5e0);
                in_RDI[4] = iVar7 + in_RDI[4];
                local_5a2c = 1;
                goto LAB_00672aea;
              }
              bVar3 = HighsSearch::backtrack
                                ((HighsSearch *)
                                 CONCAT44(in_stack_ffffffffffffa35c,in_stack_ffffffffffffa358),
                                 SUB81((ulong)in_stack_ffffffffffffa350 >> 0x38,0));
              if (!bVar3) goto LAB_006725c3;
              HeuristicNeighbourhood::backtracked
                        ((HeuristicNeighbourhood *)
                         CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250));
            }
            local_59c8 = (HighsMipSolver *)
                         HeuristicNeighbourhood::getFixingRate
                                   ((HeuristicNeighbourhood *)in_stack_ffffffffffffa260);
            if ((((local_59c9 & 1) != 0) || (local_59b8 <= (double)local_59c8)) || (9 < local_59d0))
            goto LAB_006725c3;
            __gnu_cxx::
            __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
            ::__normal_iterator(&local_5a38);
            HighsLpRelaxation::getFractionalIntegers((HighsLpRelaxation *)local_59b0);
            local_5a48 = (pair<int,_double> *)
                         std::
                         vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                         begin((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                *)CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
            HighsLpRelaxation::getFractionalIntegers((HighsLpRelaxation *)local_59b0);
            local_5a50 = (pair<int,_double> *)
                         std::
                         vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                         end((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
            local_5a60 = local_10;
            __pred_00.this._0_4_ = in_stack_ffffffffffffa278;
            __pred_00.relaxationsol =
                 (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa270._M_current;
            __pred_00.this._4_4_ = in_stack_ffffffffffffa27c;
            local_5a40 = (pair<int,_double> *)
                         std::
                         partition<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__1>
                                   (in_stack_ffffffffffffa288,in_stack_ffffffffffffa280,__pred_00);
            local_5a61 = 1;
            local_5b10._136_8_ = &local_5a61;
            local_5a80 = local_10;
            local_5b10._132_4_ = 0;
            local_5a70 = this_00;
            local_5a38 = (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          )local_5a40;
            HighsLpRelaxation::getFractionalIntegers((HighsLpRelaxation *)local_59b0);
            local_5b10._120_8_ =
                 std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 begin((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
            bVar3 = __gnu_cxx::operator==
                              ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250),
                               (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
            if (bVar3) break;
LAB_00672127:
            HighsLpRelaxation::getFractionalIntegers((HighsLpRelaxation *)local_59b0);
            local_5b10._40_8_ =
                 std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 begin((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
            local_5b10._32_8_ = local_5a38._M_current;
            local_5b10._16_8_ = local_5b10 + 0x88;
            local_5b10._24_8_ = local_59b0;
            end._M_current._4_4_ = in_stack_ffffffffffffa27c;
            end._M_current._0_4_ = in_stack_ffffffffffffa278;
            comp.getFixVal._4_4_ = in_stack_ffffffffffffa26c;
            comp.getFixVal._0_4_ = in_stack_ffffffffffffa268;
            comp.heurlp = (HighsLpRelaxation *)in_stack_ffffffffffffa270._M_current;
            pdqsort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__2>
                      (in_stack_ffffffffffffa280,end,comp);
            local_5b10._8_8_ = (pointer)0x0;
            HighsLpRelaxation::getFractionalIntegers((HighsLpRelaxation *)local_59b0);
            local_5b10._0_8_ =
                 std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 begin((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
            while (bVar3 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                       *)CONCAT44(in_stack_ffffffffffffa254,
                                                  in_stack_ffffffffffffa250),
                                      (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                       *)CONCAT44(in_stack_ffffffffffffa24c,
                                                  in_stack_ffffffffffffa248)), bVar3) {
              p_Var15 = (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                         *)local_5b10;
              ppVar12 = __gnu_cxx::
                        __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        ::operator->(p_Var15);
              in_stack_ffffffffffffa37c = ppVar12->first;
              __gnu_cxx::
              __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
              ::operator->(p_Var15);
              in_stack_ffffffffffffa4e8 =
                   (HighsDomain *)
                   RINS::anon_class_32_4_ffb23deb::operator()
                             ((anon_class_32_4_ffb23deb *)in_stack_ffffffffffffa280._M_current,
                              in_stack_ffffffffffffa27c,(double)in_stack_ffffffffffffa270._M_current
                             );
              ppVar12 = __gnu_cxx::
                        __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        ::operator->((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                      *)local_5b10);
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &(this_00->localdom).redundantRows_.numElements,
                                   (long)ppVar12->first);
              if (*pvVar13 < (double)in_stack_ffffffffffffa4e8) {
                local_5b10._132_4_ = local_5b10._132_4_ + 1;
                in_stack_ffffffffffffa350 =
                     (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                      *)local_5b10;
                ppVar12 = __gnu_cxx::
                          __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          ::operator->(in_stack_ffffffffffffa350);
                in_stack_ffffffffffffa35c = ppVar12->first;
                __gnu_cxx::
                __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                ::operator->(in_stack_ffffffffffffa350);
                HighsSearch::branchUpwards
                          (in_stack_ffffffffffffa2e0,
                           (HighsInt)((ulong)in_stack_ffffffffffffa2d8 >> 0x20),
                           (double)in_stack_ffffffffffffa2d0,in_stack_ffffffffffffa2c8);
                bVar3 = HighsDomain::infeasible((HighsDomain *)this_00);
                if (bVar3) {
                  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                  operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              *)0x672366);
                  HighsDomain::conflictAnalysis
                            ((HighsDomain *)
                             CONCAT44(in_stack_ffffffffffffa324,in_stack_ffffffffffffa320),
                             in_stack_ffffffffffffa318);
                  break;
                }
                local_59c8 = (HighsMipSolver *)
                             HeuristicNeighbourhood::getFixingRate
                                       ((HeuristicNeighbourhood *)in_stack_ffffffffffffa260);
              }
              ppVar12 = __gnu_cxx::
                        __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        ::operator->((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                      *)local_5b10);
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &(this_00->localdom).col_lower_.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(long)ppVar12->first);
              if ((double)in_stack_ffffffffffffa4e8 < *pvVar13) {
                local_5b10._132_4_ = local_5b10._132_4_ + 1;
                in_stack_ffffffffffffa318 = (HighsConflictPool *)local_5b10;
                ppVar12 = __gnu_cxx::
                          __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          ::operator->((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                        *)in_stack_ffffffffffffa318);
                in_stack_ffffffffffffa324 = ppVar12->first;
                __gnu_cxx::
                __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                ::operator->((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                              *)in_stack_ffffffffffffa318);
                HighsSearch::branchDownwards
                          (in_stack_ffffffffffffa2e0,
                           (HighsInt)((ulong)in_stack_ffffffffffffa2d8 >> 0x20),
                           (double)in_stack_ffffffffffffa2d0,in_stack_ffffffffffffa2c8);
                bVar3 = HighsDomain::infeasible((HighsDomain *)this_00);
                if (bVar3) {
                  in_stack_ffffffffffffa308 = this_00;
                  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                  operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              *)0x6724af);
                  HighsDomain::conflictAnalysis
                            ((HighsDomain *)
                             CONCAT44(in_stack_ffffffffffffa324,in_stack_ffffffffffffa320),
                             in_stack_ffffffffffffa318);
                  break;
                }
                in_stack_ffffffffffffa300 =
                     (HighsMipSolver *)
                     HeuristicNeighbourhood::getFixingRate
                               ((HeuristicNeighbourhood *)in_stack_ffffffffffffa260);
                local_59c8 = in_stack_ffffffffffffa300;
              }
              if (local_59b8 <= (double)local_59c8) break;
              p_Var15 = (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                         *)local_5b10;
              __gnu_cxx::
              __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
              ::operator->(p_Var15);
              std::abs((int)p_Var15);
              local_5b10._8_8_ = extraout_XMM0_Qa_00 + (double)local_5b10._8_8_;
              if (0.5 <= (double)local_5b10._8_8_) break;
              __gnu_cxx::
              __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
              ::operator++((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                            *)local_5b10);
            }
            if (local_5b10._132_4_ == 0) goto LAB_006725c3;
            HighsLpRelaxation::flushDomain
                      ((HighsLpRelaxation *)
                       CONCAT17(in_stack_ffffffffffffa2a7,in_stack_ffffffffffffa2a0),
                       in_stack_ffffffffffffa298,SUB81((ulong)in_stack_ffffffffffffa290 >> 0x38,0));
          }
          local_59c8 = (HighsMipSolver *)
                       HeuristicNeighbourhood::getFixingRate
                                 ((HeuristicNeighbourhood *)in_stack_ffffffffffffa260);
          local_5b10._104_8_ = (1.0 - (double)local_59c8) * -0.9 + 1.0;
          pdVar8 = std::min<double>(&local_59b8,(double *)(local_5b10 + 0x68));
          local_5b10._112_8_ = *pdVar8;
          pHVar9 = HighsLpRelaxation::getSolution((HighsLpRelaxation *)0x671c8a);
          local_5b10._96_8_ = &pHVar9->col_value;
          local_5b10._88_8_ = in_RDI + 10;
          local_5b10._80_8_ =
               std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
          local_5b10._72_8_ =
               std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250)
                                    ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248
                                                )), bVar3) {
            piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )(local_5b10 + 0x50));
            local_5b10._68_4_ = *piVar10;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &(this_00->localdom).redundantRows_.numElements,
                                 (long)(int)local_5b10._68_4_);
            dVar1 = *pvVar13;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &(this_00->localdom).col_lower_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish,(long)(int)local_5b10._68_4_);
            if ((dVar1 != *pvVar13) || (NAN(dVar1) || NAN(*pvVar13))) {
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_5b10._96_8_,
                         (long)(int)local_5b10._68_4_);
              pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x671db1);
              this_02 = &pHVar5->incumbent;
              std::vector<double,_std::allocator<double>_>::operator[]
                        (this_02,(long)(int)local_5b10._68_4_);
              std::abs((int)this_02);
              pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x671e00);
              if (extraout_XMM0_Qa <= pHVar5->feastol) {
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)local_5b10._96_8_,
                                     (long)(int)local_5b10._68_4_);
                iVar7 = HighsIntegers::nearestInteger(*pvVar11);
                local_5b10._56_8_ = (undefined8)iVar7;
                pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)
                                     &(this_00->localdom).redundantRows_.numElements,
                                     (long)(int)local_5b10._68_4_);
                if (*pvVar13 < (double)local_5b10._56_8_) {
                  local_5b10._132_4_ = local_5b10._132_4_ + 1;
                  HighsSearch::branchUpwards
                            (in_stack_ffffffffffffa2e0,
                             (HighsInt)((ulong)in_stack_ffffffffffffa2d8 >> 0x20),
                             (double)in_stack_ffffffffffffa2d0,in_stack_ffffffffffffa2c8);
                  HighsDomain::propagate(in_stack_ffffffffffffa4e8);
                  bVar3 = HighsDomain::infeasible((HighsDomain *)this_00);
                  if (bVar3) {
                    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                    operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                *)0x671f23);
                    HighsDomain::conflictAnalysis
                              ((HighsDomain *)
                               CONCAT44(in_stack_ffffffffffffa324,in_stack_ffffffffffffa320),
                               in_stack_ffffffffffffa318);
                    break;
                  }
                  local_59c8 = (HighsMipSolver *)
                               HeuristicNeighbourhood::getFixingRate
                                         ((HeuristicNeighbourhood *)in_stack_ffffffffffffa260);
                }
                pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)
                                     &(this_00->localdom).col_lower_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish,(long)(int)local_5b10._68_4_
                                    );
                if ((double)local_5b10._56_8_ < *pvVar13) {
                  local_5b10._132_4_ = local_5b10._132_4_ + 1;
                  HighsSearch::branchDownwards
                            (in_stack_ffffffffffffa2e0,
                             (HighsInt)((ulong)in_stack_ffffffffffffa2d8 >> 0x20),
                             (double)in_stack_ffffffffffffa2d0,in_stack_ffffffffffffa2c8);
                  HighsDomain::propagate(in_stack_ffffffffffffa4e8);
                  bVar3 = HighsDomain::infeasible((HighsDomain *)this_00);
                  if (bVar3) {
                    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                    operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                *)0x672031);
                    HighsDomain::conflictAnalysis
                              ((HighsDomain *)
                               CONCAT44(in_stack_ffffffffffffa324,in_stack_ffffffffffffa320),
                               in_stack_ffffffffffffa318);
                    break;
                  }
                  local_59c8 = (HighsMipSolver *)
                               HeuristicNeighbourhood::getFixingRate
                                         ((HeuristicNeighbourhood *)in_stack_ffffffffffffa260);
                }
                if ((double)local_5b10._112_8_ <= (double)local_59c8) break;
              }
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       (local_5b10 + 0x50));
          }
          if (local_5b10._132_4_ == 0) goto LAB_006720ca;
          HighsLpRelaxation::flushDomain
                    ((HighsLpRelaxation *)
                     CONCAT17(in_stack_ffffffffffffa2a7,in_stack_ffffffffffffa2a0),
                     in_stack_ffffffffffffa298,SUB81((ulong)in_stack_ffffffffffffa290 >> 0x38,0));
        } while( true );
      }
      iVar7 = HighsSearch::getLocalLpIterations(&local_5e0);
      in_RDI[4] = iVar7 + in_RDI[4];
      local_5a2c = 1;
      goto LAB_00672aea;
    }
  }
  return;
LAB_006720ca:
  if ((double)local_59c8 < local_59c0) {
    HighsLpRelaxation::getFractionalIntegers((HighsLpRelaxation *)local_59b0);
    local_5b10._48_8_ =
         std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                   ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    CONCAT44(in_stack_ffffffffffffa24c,in_stack_ffffffffffffa248));
    local_5a61 = 0;
    local_5a38._M_current = (pair<int,_double> *)local_5b10._48_8_;
    goto LAB_00672127;
  }
LAB_006725c3:
  bVar3 = HighsSearch::hasNode((HighsSearch *)0x6725d0);
  if (!bVar3) {
    iVar7 = HighsSearch::getLocalLpIterations(&local_5e0);
    in_RDI[4] = iVar7 + in_RDI[4];
    local_5a2c = 1;
    goto LAB_00672aea;
  }
  in_stack_ffffffffffffa2d8 =
       (HighsMipSolver *)
       HeuristicNeighbourhood::getFixingRate((HeuristicNeighbourhood *)in_stack_ffffffffffffa260);
  local_59c8 = in_stack_ffffffffffffa2d8;
  if (((double)in_stack_ffffffffffffa2d8 < 0.1) ||
     (((*(byte *)(*in_RDI + 0xb0) & 1) != 0 &&
      (pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            *)0x672691), pHVar5->numImprovingSols != 0)))) {
    HighsSearch::setMinReliable
              ((HighsSearch *)CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250),
               in_stack_ffffffffffffa24c);
    HighsSearch::solveDepthFirst(in_stack_ffffffffffffa260,in_stack_ffffffffffffa258);
    iVar7 = HighsSearch::getLocalLpIterations(&local_5e0);
    in_RDI[4] = iVar7 + in_RDI[4];
    if ((*(byte *)(*in_RDI + 0xb0) & 1) != 0) {
      iVar7 = HighsSearch::getLocalNodes(&local_5e0);
      pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x67272c);
      pHVar5->num_nodes = iVar7 + pHVar5->num_nodes;
    }
    local_5a2c = 1;
    goto LAB_00672aea;
  }
  HighsLpRelaxation::removeObsoleteRows
            ((HighsLpRelaxation *)CONCAT17(in_stack_ffffffffffffa2a7,in_stack_ffffffffffffa2a0),
             SUB81((ulong)in_stack_ffffffffffffa298 >> 0x38,0));
  HighsLpRelaxation::getLp((HighsLpRelaxation *)0x672770);
  this_01 = (HighsMipSolverData *)HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)local_59b0);
  nodeOffset = Highs::getBasis((Highs *)this_01);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffa2a7,in_stack_ffffffffffffa2a0),
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa298);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffa2a7,in_stack_ffffffffffffa2a0),
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa298);
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6727fe);
  auVar2 = SEXT816(pHVar5->num_nodes) * SEXT816(0x6666666666666667);
  in_stack_ffffffffffffa248 = ((int)(auVar2._8_8_ >> 3) + 200) - (auVar2._12_4_ >> 0x1f);
  in_stack_ffffffffffffa250 = 0xc;
  in_stack_ffffffffffffa2a7 =
       solveSubMip(in_stack_ffffffffffffae88,in_stack_ffffffffffffae80,in_stack_ffffffffffffae78,
                   (double)in_stack_ffffffffffffae70,in_stack_ffffffffffffae68,
                   in_stack_ffffffffffffae60,in_stack_ffffffffffffae5c,in_stack_ffffffffffffaea0,
                   in_stack_ffffffffffffaea8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa260);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa260);
  if ((in_stack_ffffffffffffa2a7 & 1) != 0) {
    iVar7 = HighsSearch::getLocalLpIterations(&local_5e0);
    in_RDI[4] = iVar7 + in_RDI[4];
    local_5a2c = 0;
    goto LAB_00672aea;
  }
  in_stack_ffffffffffffa290 = in_RDI[4];
  in_stack_ffffffffffffa298 = (HighsDomain *)HighsSearch::getLocalLpIterations(&local_5e0);
  pHVar14 = (HighsLpRelaxation *)
            ((long)&(in_stack_ffffffffffffa298->changedcolsflags_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + in_stack_ffffffffffffa290);
  in_stack_ffffffffffffa270._M_current = (int *)pHVar14;
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x672907);
  in_stack_ffffffffffffa288._M_current =
       (pair<int,_double> *)
       ((long)&((HighsLpRelaxation *)in_stack_ffffffffffffa270._M_current)->mipsolver +
       pHVar5->heuristic_lp_iterations);
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x672932);
  in_stack_ffffffffffffa278 = (undefined4)pHVar5->total_lp_iterations;
  in_stack_ffffffffffffa27c = (HighsInt)((ulong)pHVar5->total_lp_iterations >> 0x20);
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x672958);
  in_stack_ffffffffffffa280._M_current =
       (pair<int,_double> *)
       (CONCAT44(in_stack_ffffffffffffa27c,in_stack_ffffffffffffa278) -
       pHVar5->heuristic_lp_iterations);
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x672983);
  if (((long)in_stack_ffffffffffffa280._M_current - pHVar5->sb_lp_iterations >> 1) + 100000 <
      (long)in_stack_ffffffffffffa288._M_current) {
    in_RDI[4] = (long)pHVar14;
    local_5a2c = 1;
    goto LAB_00672aea;
  }
  in_stack_ffffffffffffa26c =
       HighsSearch::getCurrentDepth
                 ((HighsSearch *)CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250));
  local_59d4 = in_stack_ffffffffffffa26c / 2;
  if (local_59d4 < 2) {
LAB_00672a76:
    in_RDI[4] = (long)pHVar14;
    local_5a2c = 1;
LAB_00672aea:
    HeuristicNeighbourhood::~HeuristicNeighbourhood((HeuristicNeighbourhood *)0x672af7);
    HighsLpRelaxation::~HighsLpRelaxation
              ((HighsLpRelaxation *)CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250));
    HighsSearch::~HighsSearch
              ((HighsSearch *)CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250));
    HighsPseudocost::~HighsPseudocost
              ((HighsPseudocost *)CONCAT44(in_stack_ffffffffffffa254,in_stack_ffffffffffffa250));
    return;
  }
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x672a5a);
  bVar3 = HighsMipSolverData::checkLimits(this_01,(int64_t)nodeOffset);
  in_stack_ffffffffffffa268 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffa268);
  if (bVar3) goto LAB_00672a76;
  local_59b8 = (double)local_59c8 * 0.5;
  goto LAB_006717f8;
}

Assistant:

void HighsPrimalHeuristics::RINS(const std::vector<double>& relaxationsol) {
  // return if domain is infeasible
  if (mipsolver.mipdata_->domain.infeasible()) return;

  if (relaxationsol.size() != static_cast<size_t>(mipsolver.numCol())) return;

  intcols.erase(std::remove_if(intcols.begin(), intcols.end(),
                               [&](HighsInt i) {
                                 return mipsolver.mipdata_->domain.isFixed(i);
                               }),
                intcols.end());

  HighsPseudocost pscost(mipsolver.mipdata_->pseudocost);
  HighsSearch heur(mipsolver, pscost);
  HighsDomain& localdom = heur.getLocalDomain();
  heur.setHeuristic(true);

  HighsLpRelaxation heurlp(mipsolver.mipdata_->lp);
  // only use the global upper limit as LP limit so that dual proofs are valid
  heurlp.setObjectiveLimit(mipsolver.mipdata_->upper_limit);
  heurlp.setAdjustSymmetricBranchingCol(false);
  heur.setLpRelaxation(&heurlp);

  heurlp.getLpSolver().changeColsBounds(0, mipsolver.numCol() - 1,
                                        localdom.col_lower_.data(),
                                        localdom.col_upper_.data());
  localdom.clearChangedCols();
  heur.createNewNode();

  // determine the initial number of unfixed variables fixing rate to decide if
  // the problem is restricted enough to be considered for solving a submip
  double maxfixingrate = determineTargetFixingRate();
  double minfixingrate = 0.25;
  double fixingrate = 0.0;
  bool stop = false;
  HighsInt nbacktracks = -1;
  HighsInt targetdepth = 1;
  HeuristicNeighbourhood neighbourhood(mipsolver, localdom);
retry:
  ++nbacktracks;
  neighbourhood.backtracked();
  // printf("current depth : %" HIGHSINT_FORMAT "   target depth : %"
  // HIGHSINT_FORMAT "\n", heur.getCurrentDepth(),
  //       targetdepth);
  if (heur.getCurrentDepth() > targetdepth) {
    if (!heur.backtrackUntilDepth(targetdepth)) {
      lp_iterations += heur.getLocalLpIterations();
      return;
    }
  }

  assert(heur.hasNode());

  while (true) {
    heur.evaluateNode();
    if (heur.currentNodePruned()) {
      ++nbacktracks;
      // printf("backtrack1\n");
      if (mipsolver.mipdata_->domain.infeasible()) {
        lp_iterations += heur.getLocalLpIterations();
        return;
      }

      if (!heur.backtrack()) break;
      neighbourhood.backtracked();
      continue;
    }

    fixingrate = neighbourhood.getFixingRate();

    if (stop) break;
    if (fixingrate >= maxfixingrate) break;
    if (nbacktracks >= 10) break;

    std::vector<std::pair<HighsInt, double>>::iterator fixcandend;

    // partition the fractional variables to consider which ones should we fix
    // in this dive first if there is an incumbent, we dive towards the RINS
    // neighbourhood
    fixcandend = std::partition(
        heurlp.getFractionalIntegers().begin(),
        heurlp.getFractionalIntegers().end(),
        [&](const std::pair<HighsInt, double>& fracvar) {
          return std::abs(relaxationsol[fracvar.first] -
                          mipsolver.mipdata_->incumbent[fracvar.first]) <=
                 mipsolver.mipdata_->feastol;
        });

    bool fixtolpsol = true;

    auto getFixVal = [&](HighsInt col, double fracval) {
      double fixval;
      if (fixtolpsol) {
        // RINS neighbourhood (with extension)
        fixval = std::floor(relaxationsol[col] + 0.5);
      } else {
        // reinforce direction of this solution away from root
        // solution if the change is at least 0.4
        // otherwise take the direction where the objective gets worse
        // if objective is zero round to nearest integer
        double rootchange = fracval - mipsolver.mipdata_->rootlpsol[col];
        if (rootchange >= 0.4)
          fixval = std::ceil(fracval);
        else if (rootchange <= -0.4)
          fixval = std::floor(fracval);
        if (mipsolver.model_->col_cost_[col] > 0.0)
          fixval = std::ceil(fracval);
        else if (mipsolver.model_->col_cost_[col] < 0.0)
          fixval = std::floor(fracval);
        else
          fixval = std::floor(fracval + 0.5);
      }
      // make sure we do not set an infeasible domain
      fixval = std::min(localdom.col_upper_[col], fixval);
      fixval = std::max(localdom.col_lower_[col], fixval);
      return fixval;
    };

    // no candidates left to fix for getting to the neighbourhood, therefore we
    // switch to a different diving strategy until the minimal fixing rate is
    // reached
    HighsInt numBranched = 0;
    if (heurlp.getFractionalIntegers().begin() == fixcandend) {
      fixingrate = neighbourhood.getFixingRate();
      double stopFixingRate =
          std::min(maxfixingrate, 1.0 - (1.0 - fixingrate) * 0.9);
      const auto& currlpsol = heurlp.getSolution().col_value;
      for (HighsInt i : intcols) {
        if (localdom.col_lower_[i] == localdom.col_upper_[i]) continue;

        if (std::abs(currlpsol[i] - mipsolver.mipdata_->incumbent[i]) <=
            mipsolver.mipdata_->feastol) {
          double fixval = HighsIntegers::nearestInteger(currlpsol[i]);
          if (localdom.col_lower_[i] < fixval) {
            ++numBranched;
            heur.branchUpwards(i, fixval, fixval - 0.5);
            localdom.propagate();
            if (localdom.infeasible()) {
              localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
              break;
            }

            fixingrate = neighbourhood.getFixingRate();
          }
          if (localdom.col_upper_[i] > fixval) {
            ++numBranched;
            heur.branchDownwards(i, fixval, fixval + 0.5);
            localdom.propagate();
            if (localdom.infeasible()) {
              localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
              break;
            }

            fixingrate = neighbourhood.getFixingRate();
          }

          if (fixingrate >= stopFixingRate) break;
        }
      }

      if (numBranched != 0) {
        // printf(
        //    "fixed %" HIGHSINT_FORMAT " additional cols, old fixing rate:
        //    %.2f%%, new fixing " "rate: %.2f%%\n", numBranched, fixingrate,
        //    getFixingRate());
        heurlp.flushDomain(localdom);
        continue;
      }

      if (fixingrate >= minfixingrate)
        break;  // if the RINS neighbourhood achieved a high enough fixing rate
                // by itself we stop here
      fixcandend = heurlp.getFractionalIntegers().end();
      // now sort the variables by their distance towards the value they will
      // be fixed to
      fixtolpsol = false;
    }

    // now sort the variables by their distance towards the value they will be
    // fixed to
    pdqsort(heurlp.getFractionalIntegers().begin(), fixcandend,
            [&](const std::pair<HighsInt, double>& a,
                const std::pair<HighsInt, double>& b) {
              return std::make_pair(
                         std::abs(getFixVal(a.first, a.second) - a.second),
                         HighsHashHelpers::hash(
                             (uint64_t(a.first) << 32) +
                             heurlp.getFractionalIntegers().size())) <
                     std::make_pair(
                         std::abs(getFixVal(b.first, b.second) - b.second),
                         HighsHashHelpers::hash(
                             (uint64_t(b.first) << 32) +
                             heurlp.getFractionalIntegers().size()));
            });

    double change = 0.0;
    // select a set of fractional variables to fix
    for (auto fracint = heurlp.getFractionalIntegers().begin();
         fracint != fixcandend; ++fracint) {
      double fixval = getFixVal(fracint->first, fracint->second);

      if (localdom.col_lower_[fracint->first] < fixval) {
        ++numBranched;
        heur.branchUpwards(fracint->first, fixval, fracint->second);
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          break;
        }

        fixingrate = neighbourhood.getFixingRate();
      }

      if (localdom.col_upper_[fracint->first] > fixval) {
        ++numBranched;
        heur.branchDownwards(fracint->first, fixval, fracint->second);
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          break;
        }

        fixingrate = neighbourhood.getFixingRate();
      }

      if (fixingrate >= maxfixingrate) break;

      change += std::abs(fixval - fracint->second);
      if (change >= 0.5) break;
    }

    if (numBranched == 0) break;

    heurlp.flushDomain(localdom);

    // printf("%" HIGHSINT_FORMAT "/%" HIGHSINT_FORMAT " fixed, fixingrate is
    // %g\n", nfixed, ntotal, fixingrate);
  }

  // if there is no node left it means we backtracked to the global domain and
  // the subproblem was solved with the dive
  if (!heur.hasNode()) {
    lp_iterations += heur.getLocalLpIterations();
    return;
  }
  // determine the fixing rate to decide if the problem is restricted enough
  // to be considered for solving a submip

  // printf("fixing rate is %g\n", fixingrate);
  fixingrate = neighbourhood.getFixingRate();
  if (fixingrate < 0.1 ||
      (mipsolver.submip && mipsolver.mipdata_->numImprovingSols != 0)) {
    // heur.childselrule = ChildSelectionRule::kBestCost;
    heur.setMinReliable(0);
    heur.solveDepthFirst(10);
    lp_iterations += heur.getLocalLpIterations();
    if (mipsolver.submip) mipsolver.mipdata_->num_nodes += heur.getLocalNodes();
    // lpiterations += heur.lpiterations;
    // pseudocost = heur.pseudocost;
    return;
  }

  heurlp.removeObsoleteRows(false);
  const bool solve_sub_mip_return =
      solveSubMip(heurlp.getLp(), heurlp.getLpSolver().getBasis(), fixingrate,
                  localdom.col_lower_, localdom.col_upper_,
                  500,  // std::max(50, int(0.05 *
                  // (mipsolver.mipdata_->num_leaves))),
                  200 + mipsolver.mipdata_->num_nodes / 20, 12);
  if (!solve_sub_mip_return) {
    int64_t new_lp_iterations = lp_iterations + heur.getLocalLpIterations();
    if (new_lp_iterations + mipsolver.mipdata_->heuristic_lp_iterations >
        100000 + ((mipsolver.mipdata_->total_lp_iterations -
                   mipsolver.mipdata_->heuristic_lp_iterations -
                   mipsolver.mipdata_->sb_lp_iterations) >>
                  1)) {
      lp_iterations = new_lp_iterations;
      return;
    }

    targetdepth = heur.getCurrentDepth() / 2;
    if (targetdepth <= 1 || mipsolver.mipdata_->checkLimits()) {
      lp_iterations = new_lp_iterations;
      return;
    }
    // printf("infeasible in root node, trying with lower fixing rate\n");
    maxfixingrate = fixingrate * 0.5;
    goto retry;
  }

  lp_iterations += heur.getLocalLpIterations();
}